

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fps_compression.cpp
# Opt level: O0

void compress_vertices(char *filename)

{
  int val;
  ostream *poVar1;
  uint local_9c;
  float *pfStack_98;
  uint32_t i_2;
  float *decompressed_z;
  uint8_t *compressed_z;
  uint32_t nr_of_compressed_z_bytes;
  uint32_t i_1;
  float *decompressed_y;
  uint8_t *compressed_y;
  uint32_t nr_of_compressed_y_bytes;
  uint32_t i;
  float *decompressed_x;
  uint8_t *puStack_58;
  uint32_t nr_of_floats;
  uint8_t *compressed_x;
  float *pfStack_48;
  uint32_t nr_of_compressed_x_bytes;
  float *z;
  float *y;
  float *x;
  uint32_t *triangles;
  float *pfStack_20;
  uint32_t nr_of_triangles;
  float *vertices;
  char *pcStack_10;
  uint32_t nr_of_vertices;
  char *filename_local;
  
  pcStack_10 = filename;
  val = trico_read_stl((uint32_t *)((long)&vertices + 4),&stack0xffffffffffffffe0,
                       (uint32_t *)((long)&triangles + 4),(uint32_t **)&x,filename);
  TestEq<int,int>(1,val,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                  ,0xac,"void compress_vertices(const char *)");
  y = (float *)trico_malloc((ulong)vertices._4_4_ << 2);
  z = (float *)trico_malloc((ulong)vertices._4_4_ << 2);
  pfStack_48 = (float *)trico_malloc((ulong)vertices._4_4_ << 2);
  trico_transpose_xyz_aos_to_soa(&y,&z,&stack0xffffffffffffffb8,pfStack_20,vertices._4_4_);
  trico_compress((uint32_t *)((long)&compressed_x + 4),&stack0xffffffffffffffa8,y,vertices._4_4_,4,
                 10);
  trico_decompress((uint32_t *)((long)&decompressed_x + 4),(float **)&nr_of_compressed_y_bytes,
                   puStack_58);
  TestEq<unsigned_int,unsigned_int>
            (vertices._4_4_,decompressed_x._4_4_,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
             ,0xbc,"void compress_vertices(const char *)");
  for (compressed_y._4_4_ = 0; compressed_y._4_4_ < decompressed_x._4_4_;
      compressed_y._4_4_ = compressed_y._4_4_ + 1) {
    TestEq<float,float>(y[compressed_y._4_4_],_nr_of_compressed_y_bytes[compressed_y._4_4_],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0xbf,"void compress_vertices(const char *)");
  }
  trico_compress((uint32_t *)&compressed_y,(uint8_t **)&decompressed_y,z,vertices._4_4_,4,10);
  trico_decompress((uint32_t *)((long)&decompressed_x + 4),(float **)&nr_of_compressed_z_bytes,
                   (uint8_t *)decompressed_y);
  TestEq<unsigned_int,unsigned_int>
            (vertices._4_4_,decompressed_x._4_4_,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
             ,200,"void compress_vertices(const char *)");
  for (compressed_z._4_4_ = 0; compressed_z._4_4_ < decompressed_x._4_4_;
      compressed_z._4_4_ = compressed_z._4_4_ + 1) {
    TestEq<float,float>(z[compressed_z._4_4_],_nr_of_compressed_z_bytes[compressed_z._4_4_],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0xcb,"void compress_vertices(const char *)");
  }
  trico_compress((uint32_t *)&compressed_z,(uint8_t **)&decompressed_z,pfStack_48,vertices._4_4_,4,
                 10);
  trico_decompress((uint32_t *)((long)&decompressed_x + 4),&stack0xffffffffffffff68,
                   (uint8_t *)decompressed_z);
  TestEq<unsigned_int,unsigned_int>
            (vertices._4_4_,decompressed_x._4_4_,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
             ,0xd4,"void compress_vertices(const char *)");
  for (local_9c = 0; local_9c < decompressed_x._4_4_; local_9c = local_9c + 1) {
    TestEq<float,float>(pfStack_48[local_9c],pfStack_98[local_9c],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0xd7,"void compress_vertices(const char *)");
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Compression ratio for x: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,((float)vertices._4_4_ * 4.0) / (float)compressed_x._4_4_);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Compression ratio for y: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,((float)vertices._4_4_ * 4.0) / (float)(uint)compressed_y);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Compression ratio for z: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,((float)vertices._4_4_ * 4.0) / (float)(uint)compressed_z);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Total compression ratio: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,((float)vertices._4_4_ * 12.0) /
                             (float)(compressed_x._4_4_ + (uint)compressed_y + (uint)compressed_z));
  std::operator<<(poVar1,"\n");
  trico_free(_nr_of_compressed_y_bytes);
  trico_free(puStack_58);
  trico_free(_nr_of_compressed_z_bytes);
  trico_free(decompressed_y);
  trico_free(pfStack_98);
  trico_free(decompressed_z);
  trico_free(y);
  trico_free(z);
  trico_free(pfStack_48);
  trico_free(pfStack_20);
  trico_free(x);
  return;
}

Assistant:

void compress_vertices(const char* filename)
  {

  uint32_t nr_of_vertices;
  float* vertices;
  uint32_t nr_of_triangles;
  uint32_t* triangles;

  TEST_EQ(1, trico_read_stl(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, filename));

  float* x = (float*)trico_malloc(sizeof(float)*nr_of_vertices);
  float* y = (float*)trico_malloc(sizeof(float)*nr_of_vertices);
  float* z = (float*)trico_malloc(sizeof(float)*nr_of_vertices);

  trico_transpose_xyz_aos_to_soa(&x, &y, &z, vertices, nr_of_vertices);

  uint32_t nr_of_compressed_x_bytes;
  uint8_t* compressed_x;
  trico_compress(&nr_of_compressed_x_bytes, &compressed_x, x, nr_of_vertices, 4, 10);

  uint32_t nr_of_floats;
  float* decompressed_x;
  trico_decompress(&nr_of_floats, &decompressed_x, compressed_x);

  TEST_EQ(nr_of_vertices, nr_of_floats);

  for (uint32_t i = 0; i < nr_of_floats; ++i)
    TEST_EQ(x[i], decompressed_x[i]);

  uint32_t nr_of_compressed_y_bytes;
  uint8_t* compressed_y;
  trico_compress(&nr_of_compressed_y_bytes, &compressed_y, y, nr_of_vertices, 4, 10);

  float* decompressed_y;
  trico_decompress(&nr_of_floats, &decompressed_y, compressed_y);

  TEST_EQ(nr_of_vertices, nr_of_floats);

  for (uint32_t i = 0; i < nr_of_floats; ++i)
    TEST_EQ(y[i], decompressed_y[i]);

  uint32_t nr_of_compressed_z_bytes;
  uint8_t* compressed_z;
  trico_compress(&nr_of_compressed_z_bytes, &compressed_z, z, nr_of_vertices, 4, 10);

  float* decompressed_z;
  trico_decompress(&nr_of_floats, &decompressed_z, compressed_z);

  TEST_EQ(nr_of_vertices, nr_of_floats);

  for (uint32_t i = 0; i < nr_of_floats; ++i)
    TEST_EQ(z[i], decompressed_z[i]);


  std::cout << "Compression ratio for x: " << ((float)nr_of_vertices*4.f) / (float)nr_of_compressed_x_bytes << "\n";
  std::cout << "Compression ratio for y: " << ((float)nr_of_vertices*4.f) / (float)nr_of_compressed_y_bytes << "\n";
  std::cout << "Compression ratio for z: " << ((float)nr_of_vertices*4.f) / (float)nr_of_compressed_z_bytes << "\n";
  std::cout << "Total compression ratio: " << ((float)nr_of_vertices*12.f) / (float)(nr_of_compressed_x_bytes + nr_of_compressed_y_bytes + nr_of_compressed_z_bytes) << "\n";

  trico_free(decompressed_x);
  trico_free(compressed_x);
  trico_free(decompressed_y);
  trico_free(compressed_y);
  trico_free(decompressed_z);
  trico_free(compressed_z);
  trico_free(x);
  trico_free(y);
  trico_free(z);
  trico_free(vertices);
  trico_free(triangles);
  }